

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64-decode.c
# Opt level: O1

int lws_b64_decode_stateful
              (lws_b64state *s,char *in,size_t *in_len,uint8_t *out,size_t *out_size,int final)

{
  int iVar1;
  size_t sVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte bVar6;
  char cVar7;
  byte bVar8;
  int iVar9;
  char cVar10;
  uchar uVar11;
  bool bVar12;
  
  pbVar3 = (byte *)(in + *in_len);
  sVar2 = *out_size;
  pbVar4 = out;
  pbVar5 = (byte *)in;
  do {
    do {
      if (((pbVar3 <= pbVar5) || (*pbVar5 == 0)) || (out + sVar2 <= pbVar4 + 4)) {
        *pbVar4 = 0;
        *in_len = (long)pbVar5 - (long)in;
        *out_size = (long)pbVar4 - (long)out;
        return 0;
      }
      iVar9 = s->i;
      bVar12 = true;
      if (iVar9 < 4) {
        while (*pbVar5 != 0) {
          s->c = 0;
          cVar10 = '\0';
          while (((pbVar5 < pbVar3 && (cVar10 == '\0')) && (bVar6 = *pbVar5, bVar6 != 0))) {
            if (bVar6 == 0x2d) {
              bVar6 = 0x2b;
            }
            bVar8 = 0x2f;
            if (bVar6 != 0x5f) {
              bVar8 = bVar6;
            }
            s->c = (uint)bVar8;
            cVar7 = '\0';
            if (0xaf < (byte)(bVar8 + 0x85)) {
              cVar7 = "|$$$}rstuvwxyz{$$$$$$$>?@ABCDEFGHIJKLMNOPQRSTUVW$$$$$$XYZ[\\]^_`abcdefghijklmnopq"
                      [bVar8 - 0x2b];
            }
            cVar10 = '\0';
            if (cVar7 != '$') {
              cVar10 = cVar7 + -0x3d;
            }
            pbVar5 = pbVar5 + 1;
            if (cVar7 == '\0') {
              cVar10 = '\0';
            }
          }
          if (s->c == 0) {
            uVar11 = '\0';
LAB_00110e0a:
            s->quad[iVar9] = uVar11;
          }
          else {
            s->len = s->len + 1;
            if (cVar10 != '\0') {
              uVar11 = cVar10 + 0xff;
              goto LAB_00110e0a;
            }
          }
          iVar1 = s->i;
          iVar9 = iVar1 + 1;
          s->i = iVar9;
          bVar12 = pbVar5 < pbVar3;
          if ((!bVar12) || (2 < iVar1)) break;
        }
      }
    } while ((final == 0) && (iVar9 != 4));
    s->i = 0;
    if (((!bVar12) || (*pbVar5 == 0)) && (s->c == 0x3d)) {
      s->len = s->len - 1;
    }
    if (1 < s->len) {
      *pbVar4 = s->quad[1] >> 4 | s->quad[0] << 2;
      pbVar4 = pbVar4 + 1;
    }
    if (2 < s->len) {
      *pbVar4 = s->quad[2] >> 2 | s->quad[1] << 4;
      pbVar4 = pbVar4 + 1;
    }
    if (3 < s->len) {
      *pbVar4 = s->quad[2] << 6 | s->quad[3];
      pbVar4 = pbVar4 + 1;
    }
    s->done = (s->done + s->len) - 1;
    s->len = 0;
  } while( true );
}

Assistant:

int
lws_b64_decode_stateful(struct lws_b64state *s, const char *in, size_t *in_len,
			uint8_t *out, size_t *out_size, int final)
{
	const char *orig_in = in, *end_in = in + *in_len;
	uint8_t *orig_out = out, *end_out = out + *out_size;

	while (in < end_in && *in && out + 4 < end_out) {

		for (; s->i < 4 && in < end_in && *in; s->i++) {
			uint8_t v;

			v = 0;
			s->c = 0;
			while (in < end_in && *in && !v) {
				s->c = v = *in++;
				/* support the url base64 variant too */
				if (v == '-')
					s->c = v = '+';
				if (v == '_')
					s->c = v = '/';
				v = (v < 43 || v > 122) ? 0 : decode[v - 43];
				if (v)
					v = (v == '$') ? 0 : v - 61;
			}
			if (s->c) {
				s->len++;
				if (v)
					s->quad[s->i] = v - 1;
			} else
				s->quad[s->i] = 0;
		}

		if (s->i != 4 && !final)
			continue;

		s->i = 0;

		/*
		 * "The '==' sequence indicates that the last group contained
		 * only one byte, and '=' indicates that it contained two
		 * bytes." (wikipedia)
		 */

		if ((in >= end_in || !*in) && s->c == '=')
			s->len--;

		if (s->len >= 2)
			*out++ = s->quad[0] << 2 | s->quad[1] >> 4;
		if (s->len >= 3)
			*out++ = s->quad[1] << 4 | s->quad[2] >> 2;
		if (s->len >= 4)
			*out++ = ((s->quad[2] << 6) & 0xc0) | s->quad[3];

		s->done += s->len - 1;
		s->len = 0;
	}

	*out = '\0';
	*in_len = in - orig_in;
	*out_size = out - orig_out;

	return 0;
}